

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O0

int blake2b_update(blake2b_state *S,void *in,size_t inlen)

{
  size_t in_RDX;
  void *in_RSI;
  blake2b_state *in_RDI;
  size_t fill;
  size_t left;
  uint8_t *pin;
  uint8_t *in_stack_000000d8;
  blake2b_state *in_stack_000000e0;
  void *local_28;
  ulong local_20;
  int local_4;
  
  if (in_RDX == 0) {
    local_4 = 0;
  }
  else if ((in_RDI == (blake2b_state *)0x0) || (in_RSI == (void *)0x0)) {
    local_4 = -1;
  }
  else if (in_RDI->f[0] == 0) {
    local_28 = in_RSI;
    local_20 = in_RDX;
    if (0x80 < in_RDI->buflen + in_RDX) {
      local_20 = 0x80 - (ulong)in_RDI->buflen;
      memcpy(in_RDI->buf + in_RDI->buflen,in_RSI,local_20);
      blake2b_increment_counter(in_RDI,0x80);
      blake2b_compress(in_stack_000000e0,in_stack_000000d8);
      in_RDI->buflen = 0;
      local_28 = (void *)(local_20 + (long)in_RSI);
      for (local_20 = in_RDX - local_20; 0x80 < local_20; local_20 = local_20 - 0x80) {
        blake2b_increment_counter(in_RDI,0x80);
        blake2b_compress(in_stack_000000e0,in_stack_000000d8);
        local_28 = (void *)((long)local_28 + 0x80);
      }
    }
    memcpy(in_RDI->buf + in_RDI->buflen,local_28,local_20);
    in_RDI->buflen = (int)local_20 + in_RDI->buflen;
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int blake2b_update(blake2b_state *S, const void *in, size_t inlen) {
	const uint8_t *pin = (const uint8_t *)in;

	if (inlen == 0) {
		return 0;
	}

	/* Sanity check */
	if (S == NULL || in == NULL) {
		return -1;
	}

	/* Is this a reused state? */
	if (S->f[0] != 0) {
		return -1;
	}

	if (S->buflen + inlen > BLAKE2B_BLOCKBYTES) {
		/* Complete current block */
		size_t left = S->buflen;
		size_t fill = BLAKE2B_BLOCKBYTES - left;
		memcpy(&S->buf[left], pin, fill);
		blake2b_increment_counter(S, BLAKE2B_BLOCKBYTES);
		blake2b_compress(S, S->buf);
		S->buflen = 0;
		inlen -= fill;
		pin += fill;
		/* Avoid buffer copies when possible */
		while (inlen > BLAKE2B_BLOCKBYTES) {
			blake2b_increment_counter(S, BLAKE2B_BLOCKBYTES);
			blake2b_compress(S, pin);
			inlen -= BLAKE2B_BLOCKBYTES;
			pin += BLAKE2B_BLOCKBYTES;
		}
	}
	memcpy(&S->buf[S->buflen], pin, inlen);
	S->buflen += (unsigned int)inlen;
	return 0;
}